

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O3

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestPackedField_Test::
TestBody(DescriptorPoolTypeResolverTest_TestPackedField_Test *this)

{
  TypeResolver *pTVar1;
  Field *pFVar2;
  Type *pTVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  AlphaNum *in_R8;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  Metadata MVar4;
  string_view name;
  string_view name_00;
  Type type;
  string local_158;
  internal local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  string local_f8;
  AlphaNum local_c8;
  StatusRep *local_98;
  Type local_90;
  
  Type::Type(&local_90,(Arena *)0x0);
  pTVar1 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  MVar4 = proto2_unittest::TestPackedTypes::GetMetadata
                    ((TestPackedTypes *)proto2_unittest::_TestPackedTypes_default_instance_);
  local_c8.piece_._M_str = ((MVar4.descriptor)->all_names_).payload_;
  local_c8.piece_._M_len = (size_t)*(ushort *)(local_c8.piece_._M_str + 2);
  local_c8.piece_._M_str = local_c8.piece_._M_str + ~local_c8.piece_._M_len;
  local_f8._M_dataplus._M_p = &DAT_00000013;
  local_f8._M_string_length = 0x123a7b0;
  local_128 = (undefined1  [8])0x1;
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x135d829;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_158,(lts_20250127 *)&local_f8,(AlphaNum *)local_128,&local_c8,in_R8);
  pTVar3 = &local_90;
  (*pTVar1->_vptr_TypeResolver[2])(&local_98,pTVar1,&local_158);
  local_138[0] = (internal)(local_98 == (StatusRep *)0x1);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_98 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_130;
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,local_138,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType( GetTypeUrl<proto2_unittest::TestPackedTypes>(), &type) .ok()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x125,local_f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    __ptr_00 = local_130;
    if (local_128 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_128 + 8))();
      __ptr_00 = local_130;
    }
  }
  else {
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_130);
    }
    name._M_str = (char *)pTVar3;
    name._M_len = (size_t)"packed_int32";
    pFVar2 = FindField((anon_unknown_0 *)&local_90,(Type *)&DAT_0000000c,name);
    if (((pFVar2 == (Field *)0x0) || ((pFVar2->field_0)._impl_.cardinality_ != 3)) ||
       ((pFVar2->field_0)._impl_.kind_ != 5)) {
      local_128[0] = (internal)0x0;
LAB_00bb43f0:
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_f8,(internal *)local_128,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_INT32, \"packed_int32\", 90)"
                 ,"false","true",in_R9);
      pTVar3 = (Type *)0x127;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x127,local_f8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((long *)local_c8.piece_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_c8.piece_._M_len + 8))();
      }
      if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_120,local_120);
      }
    }
    else {
      local_128[0] = (internal)((pFVar2->field_0)._impl_.number_ == 0x5a);
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_128[0]) goto LAB_00bb43f0;
    }
    name_00._M_str = (char *)pTVar3;
    name_00._M_len = (size_t)"packed_int32";
    pFVar2 = FindField((anon_unknown_0 *)&local_90,(Type *)&DAT_0000000c,name_00);
    if (pFVar2 == (Field *)0x0) {
      local_128 = (undefined1  [8])((ulong)(uint7)local_128._1_7_ << 8);
    }
    else {
      local_128[0] = (internal)(pFVar2->field_0)._impl_.packed_;
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_128[0] != (internal)0x0) goto LAB_00bb458c;
    }
    local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_120;
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_128,(AssertionResult *)"IsPacked(type, \"packed_int32\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x128,local_f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    __ptr_00 = local_120;
    if ((long *)local_c8.piece_._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_c8.piece_._M_len + 8))();
      __ptr_00 = local_120;
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr_00);
  }
LAB_00bb458c:
  Type::~Type(&local_90);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestPackedField) {
  Type type;
  ASSERT_TRUE(resolver_
                  ->ResolveMessageType(
                      GetTypeUrl<proto2_unittest::TestPackedTypes>(), &type)
                  .ok());
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_INT32,
                       "packed_int32", 90));
  EXPECT_TRUE(IsPacked(type, "packed_int32"));
}